

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O0

void resolve_brackets(BidiContext *ctx,size_t copen,size_t cclose)

{
  _Bool _Var1;
  BidiType t_00;
  BidiType t;
  size_t cclose_local;
  size_t copen_local;
  BidiContext *ctx_local;
  
  _Var1 = typeIsNeutral(ctx->types[ctx->irs[copen]]);
  if (((_Var1) && (_Var1 = typeIsNeutral(ctx->types[ctx->irs[cclose]]), _Var1)) &&
     (t_00 = get_bracket_type(ctx,copen,cclose), t_00 != ON)) {
    reset_bracket_type(ctx,copen,t_00);
    reset_bracket_type(ctx,cclose,t_00);
  }
  return;
}

Assistant:

static void resolve_brackets(BidiContext *ctx, size_t copen, size_t cclose)
{
    if (typeIsNeutral(ctx->types[ctx->irs[copen]]) &&
        typeIsNeutral(ctx->types[ctx->irs[cclose]])) {
        BidiType t = get_bracket_type(ctx, copen, cclose);
        if (t != ON) {
            reset_bracket_type(ctx, copen, t);
            reset_bracket_type(ctx, cclose, t);
        }
    }
}